

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O3

ngram_model_t * ngram_model_set_remove(ngram_model_t *base,char *name,int reuse_widmap)

{
  ngram_model_t *pnVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint n;
  long lVar7;
  uint32 *puVar8;
  ulong uVar9;
  ulong uVar10;
  float64 fVar11;
  
  iVar4 = base[1].refcount;
  if ((long)iVar4 < 1) {
    uVar9 = 0;
LAB_001325bc:
    if ((int)uVar9 != iVar4) {
      uVar10 = uVar9 & 0xffffffff;
      pnVar1 = *(ngram_model_t **)(base[1].n_counts + uVar10 * 2);
      fVar11 = logmath_exp(base->lmath,*(int *)(*(long *)&base[1].n + uVar10 * 4));
      iVar4 = logmath_log(base->lmath,(float64)(1.0 - (double)(float)(double)fVar11));
      base[1].refcount = base[1].refcount + -1;
      ckd_free(*(void **)(*(long *)&base[1].n_1g_alloc + uVar10 * 8));
      *(undefined8 *)(*(long *)&base[1].n_1g_alloc + uVar10 * 8) = 0;
      lVar7 = (long)base[1].refcount;
      if (lVar7 < 1) {
        puVar8 = base[1].n_counts;
        n = 0;
      }
      else {
        n = 0;
        uVar5 = 0;
        do {
          if (uVar5 < uVar10) {
            lVar7 = *(long *)&base[1].n;
            iVar3 = *(int *)(lVar7 + uVar5 * 4);
          }
          else {
            *(undefined8 *)(base[1].n_counts + uVar5 * 2) =
                 *(undefined8 *)(base[1].n_counts + uVar5 * 2 + 2);
            *(undefined8 *)(*(long *)&base[1].n_1g_alloc + uVar5 * 8) =
                 *(undefined8 *)(*(long *)&base[1].n_1g_alloc + 8 + uVar5 * 8);
            lVar7 = *(long *)&base[1].n;
            iVar3 = *(int *)(lVar7 + 4 + uVar5 * 4);
            *(int *)(lVar7 + uVar5 * 4) = iVar3;
          }
          uVar6 = uVar5 + 1;
          *(int *)(lVar7 + uVar5 * 4) = iVar3 - iVar4;
          puVar8 = base[1].n_counts;
          if (n <= *(byte *)(*(long *)(puVar8 + uVar5 * 2) + 0x18)) {
            n = (uint)*(byte *)(*(long *)(puVar8 + uVar5 * 2) + 0x18);
          }
          lVar7 = (long)base[1].refcount;
          uVar5 = uVar6;
        } while ((long)uVar6 < lVar7);
      }
      (puVar8 + lVar7 * 2)[0] = 0;
      (puVar8 + lVar7 * 2)[1] = 0;
      *(int32 *)(*(long *)&base[1].n + lVar7 * 4) = base->log_zero;
      if (reuse_widmap != 0) {
        if (base->n_words < 1) {
          return pnVar1;
        }
        lVar7 = 0;
        do {
          pvVar2 = (&((base[1].lmath)->t).table)[lVar7];
          memmove((void *)((long)pvVar2 + uVar10 * 4),(void *)((long)pvVar2 + uVar10 * 4 + 4),
                  ((long)base[1].refcount - (long)(int)uVar9) * 4);
          lVar7 = lVar7 + 1;
        } while (lVar7 < base->n_words);
        return pnVar1;
      }
      build_widmap(base,base->lmath,n);
      return pnVar1;
    }
  }
  else {
    lVar7 = *(long *)&base[1].n_1g_alloc;
    uVar9 = 0;
    do {
      iVar3 = strcmp(name,*(char **)(lVar7 + uVar9 * 8));
      if (iVar3 == 0) goto LAB_001325bc;
      uVar9 = uVar9 + 1;
    } while ((long)iVar4 != uVar9);
  }
  return (ngram_model_t *)0x0;
}

Assistant:

ngram_model_t *
ngram_model_set_remove(ngram_model_t * base,
                       const char *name, int reuse_widmap)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    ngram_model_t *submodel;
    int32 lmidx, scale, n, i;
    float32 fprob;

    for (lmidx = 0; lmidx < set->n_models; ++lmidx)
        if (0 == strcmp(name, set->names[lmidx]))
            break;
    if (lmidx == set->n_models)
        return NULL;
    submodel = set->lms[lmidx];

    /* Renormalize the interpolation weights by scaling them by
     * 1/(1-fprob) */
    fprob = (float32) logmath_exp(base->lmath, set->lweights[lmidx]);
    scale = logmath_log(base->lmath, 1.0 - fprob);

    /* Remove it from the array of lms, renormalize remaining weights,
     * and recalcluate n. */
    --set->n_models;
    n = 0;
    ckd_free(set->names[lmidx]);
    set->names[lmidx] = NULL;
    for (i = 0; i < set->n_models; ++i) {
        if (i >= lmidx) {
            set->lms[i] = set->lms[i + 1];
            set->names[i] = set->names[i + 1];
            set->lweights[i] = set->lweights[i + 1];
        }
        set->lweights[i] -= scale;
        if (set->lms[i]->n > n)
            n = set->lms[i]->n;
    }
    /* There's no need to shrink these arrays. */
    set->lms[set->n_models] = NULL;
    set->lweights[set->n_models] = base->log_zero;
    /* No need to shrink maphist either. */

    /* Reuse the existing word ID mapping if requested. */
    if (reuse_widmap) {
        /* Just go through and shrink each row. */
        for (i = 0; i < base->n_words; ++i) {
            memmove(set->widmap[i] + lmidx, set->widmap[i] + lmidx + 1,
                    (set->n_models - lmidx) * sizeof(**set->widmap));
        }
    }
    else {
        build_widmap(base, base->lmath, n);
    }
    return submodel;
}